

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_input_is_mouse_pressed(nk_input *i,nk_buttons id)

{
  nk_mouse_button *pnVar1;
  nk_mouse_button *b;
  nk_buttons id_local;
  nk_input *i_local;
  
  if (i == (nk_input *)0x0) {
    i_local._4_4_ = 0;
  }
  else {
    pnVar1 = (i->mouse).buttons + id;
    if ((pnVar1->down == 0) || (pnVar1->clicked == 0)) {
      i_local._4_4_ = 0;
    }
    else {
      i_local._4_4_ = 1;
    }
  }
  return i_local._4_4_;
}

Assistant:

NK_API int
nk_input_is_mouse_pressed(const struct nk_input *i, enum nk_buttons id)
{
    const struct nk_mouse_button *b;
    if (!i) return nk_false;
    b = &i->mouse.buttons[id];
    if (b->down && b->clicked)
        return nk_true;
    return nk_false;
}